

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::Clear(ChAssembly *this)

{
  RemoveAllLinks(this);
  RemoveAllBodies(this);
  RemoveAllShafts(this);
  RemoveAllMeshes(this);
  RemoveAllOtherPhysicsItems(this);
  this->ndoc_w_C = 0;
  this->ndoc_w_D = 0;
  this->nbodies = 0;
  this->nbodies_sleep = 0;
  this->nbodies_fixed = 0;
  this->nshafts = 0;
  this->nshafts_sleep = 0;
  this->nshafts_fixed = 0;
  this->nlinks = 0;
  this->nmeshes = 0;
  this->nphysicsitems = 0;
  this->ncoords = 0;
  this->ndoc = 0;
  this->nsysvars = 0;
  this->ncoords_w = 0;
  this->ndoc_w = 0;
  this->nsysvars_w = 0;
  this->ndof = 0;
  return;
}

Assistant:

void ChAssembly::Clear() {
    RemoveAllLinks();
    RemoveAllBodies();
    RemoveAllShafts();
    RemoveAllMeshes();
    RemoveAllOtherPhysicsItems();

    nbodies = 0;
    nbodies_sleep = 0;
    nbodies_fixed = 0;
    nshafts = 0;
    nshafts_sleep = 0;
    nshafts_fixed = 0;
    nlinks = 0;
    nmeshes = 0;
    nphysicsitems = 0;
    ndof = 0;
    ndoc = 0;
    ndoc_w = 0;
    ndoc_w_C = 0;
    ndoc_w_D = 0;
    nsysvars_w = 0;
    ncoords = 0;
    ncoords_w = 0;
    nsysvars = 0;
    ncoords_w = 0;
}